

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

void re2c::prtHex(ostream *o,uint32_t c)

{
  char cVar1;
  uint32_t uVar2;
  opt_t *poVar3;
  ostream *poVar4;
  uint32_t cunit_size;
  uint32_t c_local;
  ostream *o_local;
  
  std::operator<<(o,"0x");
  poVar3 = Opt::operator->((Opt *)&opts);
  uVar2 = Enc::szCodeUnit(&poVar3->encoding);
  if (3 < uVar2) {
    cVar1 = hexCh(c >> 0x1c);
    poVar4 = std::operator<<(o,cVar1);
    cVar1 = hexCh(c >> 0x18);
    poVar4 = std::operator<<(poVar4,cVar1);
    cVar1 = hexCh(c >> 0x14);
    poVar4 = std::operator<<(poVar4,cVar1);
    cVar1 = hexCh(c >> 0x10);
    std::operator<<(poVar4,cVar1);
  }
  if (1 < uVar2) {
    cVar1 = hexCh(c >> 0xc);
    poVar4 = std::operator<<(o,cVar1);
    cVar1 = hexCh(c >> 8);
    std::operator<<(poVar4,cVar1);
  }
  cVar1 = hexCh(c >> 4);
  poVar4 = std::operator<<(o,cVar1);
  cVar1 = hexCh(c);
  std::operator<<(poVar4,cVar1);
  return;
}

Assistant:

void prtHex(std::ostream& o, uint32_t c)
{
	o << "0x";
	const uint32_t cunit_size = opts->encoding.szCodeUnit ();
	if (cunit_size >= 4)
	{
		o << hexCh (c >> 28u)
			<< hexCh (c >> 24u)
			<< hexCh (c >> 20u)
			<< hexCh (c >> 16u);
	}
	if (cunit_size >= 2)
	{
		o << hexCh (c >> 12u)
			<< hexCh (c >> 8u);
	}
	o << hexCh (c >> 4u)
		<< hexCh (c);
}